

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O2

int inflateInit2_(z_streamp strm,int windowBits,char *version,int stream_size)

{
  int iVar1;
  code *pcVar2;
  internal_state *piVar3;
  
  iVar1 = -6;
  if (((version != (char *)0x0) && (stream_size == 0x70)) && (*version == '1')) {
    if (strm == (z_streamp)0x0) {
      iVar1 = -2;
    }
    else {
      strm->msg = (char *)0x0;
      pcVar2 = strm->zalloc;
      if (pcVar2 == (alloc_func)0x0) {
        pcVar2 = zcalloc;
        strm->zalloc = zcalloc;
        strm->opaque = (voidpf)0x0;
      }
      if (strm->zfree == (free_func)0x0) {
        strm->zfree = zcfree;
      }
      piVar3 = (internal_state *)(*pcVar2)(strm->opaque,1,0x1bf8);
      if (piVar3 == (internal_state *)0x0) {
        iVar1 = -4;
      }
      else {
        strm->state = piVar3;
        piVar3->strm = strm;
        piVar3->method = '\0';
        *(undefined3 *)&piVar3->field_0x49 = 0;
        piVar3->last_flush = 0;
        piVar3->status = 0x3f34;
        iVar1 = inflateReset2(strm,windowBits);
        if (iVar1 == 0) {
          iVar1 = 0;
        }
        else {
          (*strm->zfree)(strm->opaque,piVar3);
          strm->state = (internal_state *)0x0;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int ZEXPORT inflateInit2_(strm, windowBits, version, stream_size)
z_streamp strm;
int windowBits;
const char *version;
int stream_size;
{
    int ret;
    struct inflate_state FAR *state;

    if (version == Z_NULL || version[0] != ZLIB_VERSION[0] ||
        stream_size != (int)(sizeof(z_stream)))
        return Z_VERSION_ERROR;
    if (strm == Z_NULL) return Z_STREAM_ERROR;
    strm->msg = Z_NULL;                 /* in case we return an error */
    if (strm->zalloc == (alloc_func)0) {
#ifdef Z_SOLO
        return Z_STREAM_ERROR;
#else
        strm->zalloc = zcalloc;
        strm->opaque = (voidpf)0;
#endif
    }
    if (strm->zfree == (free_func)0)
#ifdef Z_SOLO
        return Z_STREAM_ERROR;
#else
        strm->zfree = zcfree;
#endif
    state = (struct inflate_state FAR *)
            ZALLOC(strm, 1, sizeof(struct inflate_state));
    if (state == Z_NULL) return Z_MEM_ERROR;
    Tracev((stderr, "inflate: allocated\n"));
    strm->state = (struct internal_state FAR *)state;
    state->strm = strm;
    state->window = Z_NULL;
    state->mode = HEAD;     /* to pass state test in inflateReset2() */
    ret = inflateReset2(strm, windowBits);
    if (ret != Z_OK) {
        ZFREE(strm, state);
        strm->state = Z_NULL;
    }
    return ret;
}